

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

string * vkt::SpirVAssembly::repeatString(string *__return_storage_ptr__,string *str,int times)

{
  int iVar1;
  bool bVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar1 = 0;
  if (0 < times) {
    iVar1 = times;
  }
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

const string repeatString (const string& str, int times)
{
	string filler;
	for (int i = 0; i < times; ++i)
	{
		filler += str;
	}
	return filler;
}